

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

string * __thiscall
Symbol_Table::get_kind(string *__return_storage_ptr__,Symbol_Table *this,string *identifier)

{
  size_type sVar1;
  mapped_type *ppIVar2;
  Symbol_Table *this_00;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
          ::count(&this->class_scope,identifier);
  this_00 = (Symbol_Table *)&this->subroutine_scope;
  if (sVar1 != 0) {
    this_00 = this;
  }
  ppIVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
            ::operator[](&this_00->class_scope,identifier);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(*ppIVar2)->kind);
  return __return_storage_ptr__;
}

Assistant:

std::string Symbol_Table::get_kind(const std::string& identifier) {
    if (class_scope.count(identifier) > 0) {
        return class_scope[identifier]->kind;
    }
    return subroutine_scope[identifier]->kind;
}